

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_setup(mbedtls_ssl_context *ssl,mbedtls_ssl_config *conf)

{
  int iVar1;
  uchar *puVar2;
  size_t len;
  int ret;
  mbedtls_ssl_config *conf_local;
  mbedtls_ssl_context *ssl_local;
  
  ssl->conf = conf;
  puVar2 = (uchar *)calloc(1,0x414d);
  ssl->in_buf = puVar2;
  if (puVar2 != (uchar *)0x0) {
    puVar2 = (uchar *)calloc(1,0x414d);
    ssl->out_buf = puVar2;
    if (puVar2 != (uchar *)0x0) {
      if ((*(uint *)&conf->field_0x164 >> 1 & 1) == 1) {
        ssl->out_hdr = ssl->out_buf;
        ssl->out_ctr = ssl->out_buf + 3;
        ssl->out_len = ssl->out_buf + 0xb;
        ssl->out_iv = ssl->out_buf + 0xd;
        ssl->out_msg = ssl->out_buf + 0xd;
        ssl->in_hdr = ssl->in_buf;
        ssl->in_ctr = ssl->in_buf + 3;
        ssl->in_len = ssl->in_buf + 0xb;
        ssl->in_iv = ssl->in_buf + 0xd;
        ssl->in_msg = ssl->in_buf + 0xd;
      }
      else {
        ssl->out_ctr = ssl->out_buf;
        ssl->out_hdr = ssl->out_buf + 8;
        ssl->out_len = ssl->out_buf + 0xb;
        ssl->out_iv = ssl->out_buf + 0xd;
        ssl->out_msg = ssl->out_buf + 0xd;
        ssl->in_ctr = ssl->in_buf;
        ssl->in_hdr = ssl->in_buf + 8;
        ssl->in_len = ssl->in_buf + 0xb;
        ssl->in_iv = ssl->in_buf + 0xd;
        ssl->in_msg = ssl->in_buf + 0xd;
      }
      iVar1 = ssl_handshake_init(ssl);
      if (iVar1 != 0) {
        return iVar1;
      }
      return 0;
    }
  }
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x14ae,"alloc(%d bytes) failed",0x414d);
  free(ssl->in_buf);
  ssl->in_buf = (uchar *)0x0;
  return -0x7f00;
}

Assistant:

int mbedtls_ssl_setup( mbedtls_ssl_context *ssl,
                       const mbedtls_ssl_config *conf )
{
    int ret;
    const size_t len = MBEDTLS_SSL_BUFFER_LEN;

    ssl->conf = conf;

    /*
     * Prepare base structures
     */
    if( ( ssl-> in_buf = mbedtls_calloc( 1, len ) ) == NULL ||
        ( ssl->out_buf = mbedtls_calloc( 1, len ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed", len ) );
        mbedtls_free( ssl->in_buf );
        ssl->in_buf = NULL;
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->out_hdr = ssl->out_buf;
        ssl->out_ctr = ssl->out_buf +  3;
        ssl->out_len = ssl->out_buf + 11;
        ssl->out_iv  = ssl->out_buf + 13;
        ssl->out_msg = ssl->out_buf + 13;

        ssl->in_hdr = ssl->in_buf;
        ssl->in_ctr = ssl->in_buf +  3;
        ssl->in_len = ssl->in_buf + 11;
        ssl->in_iv  = ssl->in_buf + 13;
        ssl->in_msg = ssl->in_buf + 13;
    }
    else
#endif
    {
        ssl->out_ctr = ssl->out_buf;
        ssl->out_hdr = ssl->out_buf +  8;
        ssl->out_len = ssl->out_buf + 11;
        ssl->out_iv  = ssl->out_buf + 13;
        ssl->out_msg = ssl->out_buf + 13;

        ssl->in_ctr = ssl->in_buf;
        ssl->in_hdr = ssl->in_buf +  8;
        ssl->in_len = ssl->in_buf + 11;
        ssl->in_iv  = ssl->in_buf + 13;
        ssl->in_msg = ssl->in_buf + 13;
    }

    if( ( ret = ssl_handshake_init( ssl ) ) != 0 )
        return( ret );

    return( 0 );
}